

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall VBW::ConvexCell::compute_mg(ConvexCell *this,double *m,vec3 *result)

{
  uint uVar1;
  pointer pTVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ushort uVar7;
  uint uVar8;
  pointer pvVar9;
  pointer pTVar10;
  pointer pTVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int iVar21;
  pointer pvVar22;
  ushort uVar23;
  ulong uVar24;
  ushort uVar25;
  ushort uVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  ushort t1t2 [2];
  ushort local_86 [2];
  allocator local_82;
  allocator local_81;
  pointer local_80;
  ConvexCell *local_78;
  string local_70;
  string local_50;
  
  result->z = 0.0;
  result->x = 0.0;
  result->y = 0.0;
  *m = 0.0;
  uVar8 = this->nb_v_;
  local_80 = (this->v2t_).
             super_vector<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>.
             super__Vector_base<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar24 = 0;
  uVar25 = 0x3fff;
  do {
    if (uVar24 == uVar8) {
      return;
    }
    uVar7 = local_80[uVar24];
    uVar26 = uVar25;
    if ((uVar7 != 0x3fff) && (uVar26 = uVar7, uVar25 != 0x3fff)) {
      pvVar9 = (this->triangle_point_).
               super_vector<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
               .
               super__Vector_base<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar22 = pvVar9 + uVar25;
      pTVar10 = (this->t_).
                super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                .
                super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar11 = (this->t_adj_).
                super_vector<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>.
                super__Vector_base<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar27 = 0;
      uVar23 = uVar7;
      do {
        if (uVar27 < 2) {
          local_86[uVar27] = uVar23;
        }
        else {
          dVar3 = pvVar22->z;
          dVar4 = pvVar9[local_86[0]].z;
          dVar5 = pvVar9[local_86[1]].z;
          dVar28 = dVar4 - dVar3;
          dVar29 = dVar5 - dVar3;
          dVar13 = pvVar22->x;
          dVar14 = pvVar22->y;
          dVar15 = pvVar9[local_86[0]].x;
          dVar16 = pvVar9[local_86[0]].y;
          dVar17 = pvVar9[local_86[1]].x;
          dVar18 = pvVar9[local_86[1]].y;
          dVar30 = dVar15 - dVar13;
          dVar31 = dVar16 - dVar14;
          dVar32 = dVar17 - dVar13;
          dVar33 = dVar18 - dVar14;
          dVar6 = pvVar9[uVar23].z;
          dVar19 = pvVar9[uVar23].x;
          dVar20 = pvVar9[uVar23].y;
          dVar28 = ABS((dVar31 * dVar29 - dVar33 * dVar28) * (dVar19 - dVar13) +
                       (dVar28 * dVar32 - dVar29 * dVar30) * (dVar20 - dVar14) +
                       (dVar33 * dVar30 - dVar32 * dVar31) * (dVar6 - dVar3)) / 6.0;
          *m = *m + dVar28;
          result->x = result->x + dVar28 * (dVar13 + dVar15 + dVar17 + dVar19) * 0.25;
          result->y = result->y + dVar28 * (dVar14 + dVar16 + dVar18 + dVar20) * 0.25;
          result->z = (dVar3 + dVar4 + dVar5 + dVar6) * dVar28 * 0.25 + result->z;
          local_86[1] = uVar23;
          if (uVar27 == 99999) {
            local_78 = this;
            std::__cxx11::string::string((string *)&local_50,"count < 100000",&local_81);
            std::__cxx11::string::string
                      ((string *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                       ,&local_82);
            GEO::geo_assertion_failed(&local_50,&local_70,0x6f32);
          }
        }
        pTVar2 = pTVar10 + uVar23;
        uVar1._0_2_ = (pTVar2->super_Triangle).i;
        uVar1._2_2_ = (pTVar2->super_Triangle).j;
        iVar21 = (uint)(uVar1 >> 0x10 == uVar24) +
                 (uint)(uVar24 == pTVar10[uVar23].super_Triangle.k) * 2;
        uVar1 = iVar21 + 1;
        uVar12 = iVar21 - 2;
        if (uVar1 < 3) {
          uVar12 = uVar1;
        }
        uVar23 = (&pTVar11[uVar23].i)[uVar12];
        uVar27 = uVar27 + 1;
        uVar26 = uVar25;
      } while (uVar23 != uVar7);
    }
    uVar24 = uVar24 + 1;
    uVar25 = uVar26;
  } while( true );
}

Assistant:

void ConvexCell::compute_mg(double& m, vec3& result) const {
	vbw_assert(!geometry_dirty_);
	result = make_vec3(0.0, 0.0, 0.0);
	m = 0.0;

	ushort t_origin = END_OF_LIST;
	for(index_t v=0; v<nb_v_; ++v) {
	    if(v2t_[v] == END_OF_LIST) {
		continue;
	    }
	    if(t_origin == END_OF_LIST) {
		t_origin = v2t_[v];
		continue;
	    }
	    ushort t1t2[2];
	    index_t cur=0;
	    index_t t = v2t_[v];
	    index_t count = 0;
	    do {
		if(cur < 2) {
		    t1t2[cur] = ushort(t);
		} else {
		    vec3 p = triangle_point_[t_origin];
		    vec3 q = triangle_point_[t1t2[0]];
		    vec3 r = triangle_point_[t1t2[1]];
		    vec3 s = triangle_point_[t];
		    double cur_m = tet_volume(p,q,r,s);
		    m += cur_m;
		    result.x += cur_m*(p.x + q.x + r.x + s.x)/4.0;
		    result.y += cur_m*(p.y + q.y + r.y + s.y)/4.0;
		    result.z += cur_m*(p.z + q.z + r.z + s.z)/4.0;
		    t1t2[1] = ushort(t);
		}
		++cur;
		index_t lv = triangle_find_vertex(t,v);		   
		t = triangle_adjacent(t, (lv + 1)%3);
		++count;
		geo_assert(count < 100000);
	    } while(t != v2t_[v]);
	}
    }